

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O0

void __thiscall Ptex::v2_4::PtexSeparableKernel::stripZeros(PtexSeparableKernel *this)

{
  PtexSeparableKernel *this_local;
  
  while ((*this->ku == 0.0 && (!NAN(*this->ku)))) {
    this->ku = this->ku + 1;
    this->u = this->u + 1;
    this->uw = this->uw + -1;
  }
  while ((this->ku[this->uw + -1] == 0.0 && (!NAN(this->ku[this->uw + -1])))) {
    this->uw = this->uw + -1;
  }
  while ((*this->kv == 0.0 && (!NAN(*this->kv)))) {
    this->kv = this->kv + 1;
    this->v = this->v + 1;
    this->vw = this->vw + -1;
  }
  while ((this->kv[this->vw + -1] == 0.0 && (!NAN(this->kv[this->vw + -1])))) {
    this->vw = this->vw + -1;
  }
  return;
}

Assistant:

void stripZeros()
    {
        while (ku[0] == 0) { ku++; u++; uw--; }
        while (ku[uw-1] == 0) { uw--; }
        while (kv[0] == 0) { kv++; v++; vw--; }
        while (kv[vw-1] == 0) { vw--; }
        assert(uw > 0 && vw > 0);
    }